

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

bool __thiscall GrcSymbolTableEntry::IsIgnorableOffsetAttr(GrcSymbolTableEntry *this)

{
  bool bVar1;
  GrcSymbolTableEntry *in_RDI;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 local_9;
  
  bVar1 = IsSequenceAttr(in_RDI);
  local_9 = false;
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
    local_9 = true;
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      local_9 = true;
      if (!bVar1) {
        local_9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
                                 );
      }
    }
  }
  return local_9;
}

Assistant:

bool GrcSymbolTableEntry::IsIgnorableOffsetAttr()
{
	Assert(FitsSymbolType(ksymtGlyphAttr));
	//Symbol psymParent = ParentSymbol();
	return (!IsSequenceAttr()
		&& (m_staFieldName == "gpoint" || m_staFieldName == "xoffset"
				|| m_staFieldName == "yoffset"));
}